

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  error_category *peVar4;
  error_category *extraout_RDX;
  error_category *extraout_RDX_00;
  uint uVar5;
  error_code ec;
  error_condition local_40 [2];
  
  ec._M_cat = ntkernel_error_category::ntkernel_category();
  ec._M_value = -0x3fffffc6;
  (**(code **)(*(long *)ec._M_cat + 0x20))(local_40,ec._M_cat,0xc000003a);
  iVar2 = strcmp((char *)CONCAT44(local_40[0]._4_4_,local_40[0]._M_value),
                 "{Path Not Found}\nThe path %hs does not exist.");
  std::__cxx11::string::~string((string *)local_40);
  if (iVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "!strcmp(ec.message().c_str(), \"{Path Not Found}\\nThe path %hs does not exist.\") failed at line "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2f);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  uVar5 = (uint)(iVar2 != 0);
  std::error_code::default_error_condition();
  local_40[0]._M_cat = (error_category *)std::_V2::generic_category();
  if (extraout_RDX != local_40[0]._M_cat) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "ec.default_error_condition().category() == std::generic_category() failed at line "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x31);
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar5 = 1;
  }
  local_40[0]._M_value = 2;
  bVar1 = std::operator==(&ec,local_40);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "ec == std::errc::no_such_file_or_directory failed at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x32);
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar5 = 1;
  }
  ec._M_cat = ntkernel_error_category::ntkernel_category();
  ec._M_value = -0x3fffffc5;
  (**(code **)(*(long *)ec._M_cat + 0x20))(local_40,ec._M_cat,0xc000003b);
  iVar2 = strcmp((char *)CONCAT44(local_40[0]._4_4_,local_40[0]._M_value),
                 "Object Path Component was not a directory object.");
  std::__cxx11::string::~string((string *)local_40);
  if (iVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "!strcmp(ec.message().c_str(), \"Object Path Component was not a directory object.\") failed at line "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3e);
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar5 = 1;
  }
  std::error_code::default_error_condition();
  peVar4 = ntkernel_error_category::ntkernel_category();
  if (extraout_RDX_00 != peVar4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "ec.default_error_condition().category() == ntkernel_category() failed at line "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x40);
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar5 = 1;
  }
  return uVar5;
}

Assistant:

int main()
{
  using namespace ntkernel_error_category;
  int retcode = 0;
  {
    std::error_code ec(static_cast<int>(0xc000003a), ntkernel_category());  // STATUS_OBJECT_PATH_NOT_FOUND
    CHECK(!strcmp(ec.message().c_str(), "{Path Not Found}\nThe path %hs does not exist."));
    // This is mapped to generic_category
    CHECK(ec.default_error_condition().category() == std::generic_category());
    CHECK(ec == std::errc::no_such_file_or_directory);
#ifdef _WIN32
    // Check we can compare to win32 error codes
    std::error_code winec(ERROR_PATH_NOT_FOUND, std::system_category());
    // Compare via mapping winec to generic_category and comparing generic_categories
    CHECK(ec == winec.default_error_condition());
    // Compare via mapping ec to generic_category and comparing generic_categories
    CHECK(ec.default_error_condition() == winec);
#endif
  }
  {
    std::error_code ec(static_cast<int>(0xc000003b), ntkernel_category());  // STATUS_OBJECT_PATH_SYNTAX_BAD
    CHECK(!strcmp(ec.message().c_str(), "Object Path Component was not a directory object."));
    // This has no mapping to generic_category
    CHECK(ec.default_error_condition().category() == ntkernel_category());
#ifdef _WIN32
    // Check we can compare to win32 error codes
    std::error_code winec(ERROR_BAD_PATHNAME, std::system_category());
    // Compare via ntkernel_category's special support for system_category
    CHECK(ec == winec.default_error_condition());
    // Compare via ntkernel_category's special support for system_category
    CHECK(ec.default_error_condition() == winec);
#endif
  }
  return retcode;
}